

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractBorder
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii)

{
  BorderStyle *style;
  QBrush *color;
  QBrush *this_00;
  QBrush *this_01;
  BorderStyle *width;
  Property PVar1;
  Declaration *pDVar2;
  _Head_base<0UL,_QBrushData_*,_false> _Var3;
  bool bVar4;
  BorderStyle BVar5;
  int iVar6;
  QBrush *pQVar7;
  QSize QVar8;
  BorderStyle *pBVar9;
  BorderStyle *width_00;
  long lVar10;
  QPalette *pal;
  int i;
  ulong uVar11;
  long in_FS_OFFSET;
  _Head_base<0UL,_QBrushData_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  extractFont(this);
  width = (BorderStyle *)(borders + 3);
  style = styles + 3;
  color = colors + 3;
  this_00 = colors + 2;
  this_01 = colors + 1;
  lVar10 = 0;
  uVar11 = 0;
  bVar4 = false;
  do {
    if ((ulong)(this->declarations).d.size <= uVar11) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar4;
      }
      __stack_chk_fail();
    }
    pDVar2 = (this->declarations).d.ptr;
    PVar1 = (pDVar2[uVar11].d.d.ptr)->propertyId;
    if (0x21 < PVar1 - Border) goto switchD_0053f58b_caseD_1f;
    pal = (QPalette *)((long)&(pDVar2->d).d.ptr + lVar10);
    switch(PVar1) {
    case Border:
      borderValue(this,(Declaration *)pal,(int *)width,style,color);
      iVar6 = borders[3];
      borders[2] = iVar6;
      borders[1] = iVar6;
      *borders = iVar6;
      BVar5 = styles[3];
      styles[2] = BVar5;
      styles[1] = BVar5;
      *styles = BVar5;
      pQVar7 = QBrush::operator=(this_00,color);
      pQVar7 = QBrush::operator=(this_01,pQVar7);
      QBrush::operator=(colors,pQVar7);
      break;
    case BorderLeft:
      pBVar9 = style;
      width_00 = width;
      pQVar7 = color;
      goto LAB_0053f73e;
    case BorderRight:
      pBVar9 = styles + 1;
      width_00 = (BorderStyle *)(borders + 1);
      pQVar7 = this_01;
      goto LAB_0053f73e;
    case BorderTop:
      pBVar9 = styles;
      width_00 = (BorderStyle *)borders;
      pQVar7 = colors;
      goto LAB_0053f73e;
    case BorderBottom:
      pBVar9 = styles + 2;
      width_00 = (BorderStyle *)(borders + 2);
      pQVar7 = this_00;
LAB_0053f73e:
      borderValue(this,(Declaration *)pal,(int *)width_00,pBVar9,pQVar7);
      break;
    default:
      goto switchD_0053f58b_caseD_1f;
    case BorderLeftStyle:
      BVar5 = Declaration::styleValue((Declaration *)pal);
      pBVar9 = style;
      goto LAB_0053f7d0;
    case BorderRightStyle:
      BVar5 = Declaration::styleValue((Declaration *)pal);
      pBVar9 = styles + 1;
      goto LAB_0053f7d0;
    case BorderTopStyle:
      BVar5 = Declaration::styleValue((Declaration *)pal);
      pBVar9 = styles;
      goto LAB_0053f7d0;
    case BorderBottomStyle:
      BVar5 = Declaration::styleValue((Declaration *)pal);
      pBVar9 = styles + 2;
      goto LAB_0053f7d0;
    case BorderStyles:
      Declaration::styleValues((Declaration *)pal,styles);
      break;
    case BorderLeftColor:
      Declaration::brushValue((Declaration *)&local_40,pal);
      pQVar7 = color;
      goto LAB_0053f6ff;
    case BorderRightColor:
      Declaration::brushValue((Declaration *)&local_40,pal);
      pQVar7 = this_01;
      goto LAB_0053f6ff;
    case BorderTopColor:
      Declaration::brushValue((Declaration *)&local_40,pal);
      pQVar7 = colors;
      goto LAB_0053f6ff;
    case BorderBottomColor:
      Declaration::brushValue((Declaration *)&local_40,pal);
      pQVar7 = this_00;
LAB_0053f6ff:
      _Var3._M_head_impl =
           (pQVar7->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      (pQVar7->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = _Var3._M_head_impl;
      QBrush::~QBrush((QBrush *)&local_40);
      break;
    case BorderColor:
      Declaration::brushValues((Declaration *)pal,colors,&this->pal);
      break;
    case BorderLeftWidth:
      BVar5 = lengthValue(this,(Declaration *)pal);
      pBVar9 = width;
      goto LAB_0053f7d0;
    case BorderRightWidth:
      BVar5 = lengthValue(this,(Declaration *)pal);
      pBVar9 = (BorderStyle *)(borders + 1);
      goto LAB_0053f7d0;
    case BorderTopWidth:
      iVar6 = lengthValue(this,(Declaration *)pal);
      *borders = iVar6;
      break;
    case BorderBottomWidth:
      BVar5 = lengthValue(this,(Declaration *)pal);
      pBVar9 = (BorderStyle *)(borders + 2);
LAB_0053f7d0:
      *pBVar9 = BVar5;
      break;
    case BorderWidth:
      lengthValues(this,(Declaration *)pal,borders);
      break;
    case BorderTopLeftRadius:
      QVar8 = sizeValue(this,(Declaration *)pal);
      *radii = QVar8;
      break;
    case BorderTopRightRadius:
      QVar8 = sizeValue(this,(Declaration *)pal);
      radii[1] = QVar8;
      break;
    case BorderBottomLeftRadius:
      QVar8 = sizeValue(this,(Declaration *)pal);
      radii[2] = QVar8;
      break;
    case BorderBottomRightRadius:
      QVar8 = sizeValue(this,(Declaration *)pal);
      radii[3] = QVar8;
      break;
    case BorderRadius:
      sizeValues(this,(Declaration *)pal,radii);
    }
    bVar4 = true;
switchD_0053f58b_caseD_1f:
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 8;
  } while( true );
}

Assistant:

bool ValueExtractor::extractBorder(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case BorderLeftWidth: borders[LeftEdge] = lengthValue(decl); break;
        case BorderRightWidth: borders[RightEdge] = lengthValue(decl); break;
        case BorderTopWidth: borders[TopEdge] = lengthValue(decl); break;
        case BorderBottomWidth: borders[BottomEdge] = lengthValue(decl); break;
        case BorderWidth: lengthValues(decl, borders); break;

        case BorderLeftColor: colors[LeftEdge] = decl.brushValue(pal); break;
        case BorderRightColor: colors[RightEdge] = decl.brushValue(pal); break;
        case BorderTopColor: colors[TopEdge] = decl.brushValue(pal); break;
        case BorderBottomColor: colors[BottomEdge] = decl.brushValue(pal); break;
        case BorderColor: decl.brushValues(colors, pal); break;

        case BorderTopStyle: styles[TopEdge] = decl.styleValue(); break;
        case BorderBottomStyle: styles[BottomEdge] = decl.styleValue(); break;
        case BorderLeftStyle: styles[LeftEdge] = decl.styleValue(); break;
        case BorderRightStyle: styles[RightEdge] = decl.styleValue(); break;
        case BorderStyles:  decl.styleValues(styles); break;

        case BorderTopLeftRadius: radii[0] = sizeValue(decl); break;
        case BorderTopRightRadius: radii[1] = sizeValue(decl); break;
        case BorderBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case BorderBottomRightRadius: radii[3] = sizeValue(decl); break;
        case BorderRadius: sizeValues(decl, radii); break;

        case BorderLeft:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            break;
        case BorderTop:
            borderValue(decl, &borders[TopEdge], &styles[TopEdge], &colors[TopEdge]);
            break;
        case BorderRight:
            borderValue(decl, &borders[RightEdge], &styles[RightEdge], &colors[RightEdge]);
            break;
        case BorderBottom:
            borderValue(decl, &borders[BottomEdge], &styles[BottomEdge], &colors[BottomEdge]);
            break;
        case Border:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}